

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O3

void __thiscall iqxmlrpc::Parser::parse(Parser *this,BuilderBase *builder)

{
  Impl *pIVar1;
  element_type *peVar2;
  ulong uVar3;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  string *psVar4;
  string local_40;
  
  pIVar1 = (this->impl_).px;
  if (pIVar1 != (Impl *)0x0) {
    psVar4 = (string *)builder;
    uVar3 = Impl::read(pIVar1,(int)builder,in_RDX,in_RCX);
    if ((uVar3 & 1) == 0) {
      __buf = extraout_RDX;
      do {
        if (((uint)uVar3 >> 8 & 1) == 0) {
          if (((uint)uVar3 >> 0x10 & 1) != 0) {
            if (builder->depth_ == 0) {
              peVar2 = (this->impl_).px;
              if (peVar2 != (element_type *)0x0) {
                peVar2->pushed_back = true;
                return;
              }
            }
            else {
              pIVar1 = (this->impl_).px;
              if (pIVar1 != (Impl *)0x0) {
                Impl::tag_name_abi_cxx11_(&local_40,pIVar1);
                builder->depth_ = builder->depth_ + -1;
                psVar4 = &local_40;
                (*builder->_vptr_BuilderBase[1])(builder);
                __buf = extraout_RDX_02;
                if (builder->depth_ == 0) {
                  builder->want_exit_ = true;
                }
                goto LAB_001636e3;
              }
            }
            goto LAB_00163730;
          }
          if (((uVar3 >> 0x20 & 1) != 0) && (builder->expect_text_ == true)) {
            get_data_abi_cxx11_(&local_40,this);
            psVar4 = &local_40;
            (*builder->_vptr_BuilderBase[2])(builder);
            __buf = extraout_RDX_00;
            goto LAB_001636e3;
          }
        }
        else {
          pIVar1 = (this->impl_).px;
          if (pIVar1 == (Impl *)0x0) goto LAB_00163730;
          Impl::tag_name_abi_cxx11_(&local_40,pIVar1);
          builder->depth_ = builder->depth_ + 1;
          psVar4 = &local_40;
          (**builder->_vptr_BuilderBase)(builder);
          __buf = extraout_RDX_01;
LAB_001636e3:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != &local_40.field_2) {
            psVar4 = (string *)(local_40.field_2._M_allocated_capacity + 1);
            operator_delete(local_40._M_dataplus._M_p,(ulong)psVar4);
            __buf = extraout_RDX_03;
          }
        }
        if (builder->want_exit_ != false) {
          return;
        }
        pIVar1 = (this->impl_).px;
        if (pIVar1 == (Impl *)0x0) goto LAB_00163730;
        uVar3 = Impl::read(pIVar1,(int)psVar4,__buf,in_RCX);
        __buf = extraout_RDX_04;
      } while ((uVar3 & 1) == 0);
    }
    return;
  }
LAB_00163730:
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<iqxmlrpc::Parser::Impl>::operator->() const [T = iqxmlrpc::Parser::Impl]"
               );
}

Assistant:

void
Parser::parse(BuilderBase& builder)
{
  for (Impl::ParseStep p = impl_->read(); !p.done; p = impl_->read()) {
    if (p.element_begin) {
      builder.visit_element(impl_->tag_name());

    } else if (p.element_end) {
      if (!builder.depth()) {
        impl_->pushed_back = true;
        break;
      }

      builder.visit_element_end(impl_->tag_name());

    } else if (p.is_text && builder.expects_text()) {
      builder.visit_text(get_data());
    }

    if (builder.wants_exit())
      break;

  } // for
}